

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

void gravity_function_dump(gravity_function_t *f,code_dump_function codef)

{
  uint32_t *puVar1;
  char *pcVar2;
  
  pcVar2 = "$anon";
  if (f->identifier != (char *)0x0) {
    pcVar2 = f->identifier;
  }
  printf("Function: %s\n",pcVar2);
  printf("Params:%d Locals:%d Temp:%d Upvalues:%d Tag:%d xdata:%p\n",(ulong)f->nparams,
         (ulong)f->nlocals,(ulong)f->ntemps,(ulong)f->nupvalues,(ulong)f->tag,f->xdata);
  if (f->tag == EXEC_TYPE_NATIVE) {
    if ((f->field_9).field_0.cpool.n != 0) {
      puts("======= CONST POOL =======");
    }
    gravity_function_array_dump(f,(f->field_9).field_0.cpool);
    if ((f->field_9).field_0.pname.n != 0) {
      puts("======= PARAM NAMES =======");
    }
    gravity_function_array_dump(f,(f->field_9).field_0.pname);
    if ((f->field_9).field_0.pvalue.n != 0) {
      puts("======= PARAM VALUES =======");
    }
    gravity_function_array_dump(f,(f->field_9).field_0.pvalue);
    puts("======= BYTECODE =======");
    puVar1 = (f->field_9).field_0.bytecode;
    if (codef != (code_dump_function)0x0 && puVar1 != (uint32_t *)0x0) {
      (*codef)(puVar1);
    }
  }
  putchar(10);
  return;
}

Assistant:

void gravity_function_dump (gravity_function_t *f, code_dump_function codef) {
    printf("Function: %s\n", (f->identifier) ? f->identifier : "$anon");
    printf("Params:%d Locals:%d Temp:%d Upvalues:%d Tag:%d xdata:%p\n", f->nparams, f->nlocals, f->ntemps, f->nupvalues, f->tag, f->xdata);

    if (f->tag == EXEC_TYPE_NATIVE) {
        if (marray_size(f->cpool)) printf("======= CONST POOL =======\n");
        gravity_function_array_dump(f, f->cpool);
        
        if (marray_size(f->pname)) printf("======= PARAM NAMES =======\n");
        gravity_function_array_dump(f, f->pname);
        
        if (marray_size(f->pvalue)) printf("======= PARAM VALUES =======\n");
        gravity_function_array_dump(f, f->pvalue);

        printf("======= BYTECODE =======\n");
        if ((f->bytecode) && (codef)) codef(f->bytecode);
    }

    printf("\n");
}